

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variable.cpp
# Opt level: O0

Variable * __thiscall Variable::get_name_abi_cxx11_(Variable *this)

{
  string *in_RSI;
  Variable *this_local;
  
  std::__cxx11::string::string((string *)this,in_RSI);
  return this;
}

Assistant:

string Variable::get_name()
{
	return name;
}